

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O3

void Rml::anon_unknown_0::SearchNavigationTarget
               (SearchNavigationResult *best_result,Element *element,
               NavigationSearchDirection direction,BoundingBox *bounding_box,
               Element *exclude_element)

{
  code *pcVar1;
  Vector2f VVar2;
  Vector2f VVar3;
  bool bVar4;
  int iVar5;
  CanFocus CVar6;
  int iVar7;
  Element *element_00;
  Box *this;
  ComputedValues *pCVar8;
  int iVar9;
  int iVar10;
  int index;
  float fVar11;
  float fVar12;
  float local_48;
  float fStack_44;
  
  iVar5 = Element::GetNumChildren(element,false);
  if (0 < iVar5) {
    index = 0;
    do {
      element_00 = Element::GetChild(element,index);
      if ((element_00 != exclude_element) &&
         (CVar6 = CanFocusElement(element_00), CVar6 != NoAndNoChildren)) {
        if (CVar6 == Yes) {
          VVar2 = Element::GetAbsoluteOffset(element_00,Border);
          this = Element::GetBox(element_00);
          VVar3 = Box::GetSize(this,Border);
          if (direction < 4) {
            local_48 = VVar2.x;
            fStack_44 = VVar2.y;
            fVar11 = VVar3.x + local_48;
            fVar12 = VVar3.y + fStack_44;
            switch(direction) {
            case Up:
              iVar7 = (int)((bounding_box->min).y - fVar12);
              if (-1 < iVar7) {
                iVar9 = (int)(local_48 - (bounding_box->max).x);
                if (iVar9 < 1) {
                  iVar9 = 0;
                }
                local_48 = (bounding_box->min).x;
LAB_00227206:
                fStack_44 = local_48 - fVar11;
LAB_0022720a:
                iVar10 = (int)fStack_44;
                if (iVar10 < 1) {
                  iVar10 = 0;
                }
                iVar7 = (iVar10 + iVar9) * 10000 + iVar7;
                if (iVar7 < best_result->heuristic) {
                  best_result->element = element_00;
                  best_result->heuristic = iVar7;
                }
              }
              break;
            case Down:
              iVar7 = (int)(fStack_44 - (bounding_box->max).y);
              if (-1 < iVar7) {
                iVar9 = (int)((bounding_box->min).x - fVar11);
                if (iVar9 < 1) {
                  iVar9 = 0;
                }
                fVar11 = (bounding_box->max).x;
                goto LAB_00227206;
              }
              break;
            case Left:
              iVar7 = (int)((bounding_box->min).x - fVar11);
              if (-1 < iVar7) {
                iVar9 = (int)(fStack_44 - (bounding_box->max).y);
                if (iVar9 < 1) {
                  iVar9 = 0;
                }
                fStack_44 = (bounding_box->min).y - fVar12;
                goto LAB_0022720a;
              }
              break;
            case Right:
              iVar7 = (int)(local_48 - (bounding_box->max).x);
              if (-1 < iVar7) {
                iVar9 = (int)((bounding_box->min).y - fVar12);
                if (iVar9 < 1) {
                  iVar9 = 0;
                }
                fStack_44 = fStack_44 - (bounding_box->max).y;
                goto LAB_0022720a;
              }
            }
          }
          else {
            bVar4 = Assert("RMLUI_ERROR",
                           "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementDocument.cpp"
                           ,0x80);
            if (!bVar4) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
          }
        }
        else {
          pCVar8 = Element::GetComputedValues(element_00);
          if (((*(uint *)&pCVar8->common >> 0xc | *(uint *)&pCVar8->common >> 10) & 3) != 0)
          goto LAB_00227267;
        }
        SearchNavigationTarget(best_result,element_00,direction,bounding_box,exclude_element);
      }
LAB_00227267:
      index = index + 1;
    } while (iVar5 != index);
  }
  return;
}

Assistant:

void SearchNavigationTarget(SearchNavigationResult& best_result, Element* element, NavigationSearchDirection direction,
		const BoundingBox& bounding_box, Element* exclude_element)
	{
		const int num_children = element->GetNumChildren();
		for (int child_index = 0; child_index < num_children; child_index++)
		{
			Element* child = element->GetChild(child_index);
			if (child == exclude_element)
				continue;

			const CanFocus can_focus = CanFocusElement(child);
			if (can_focus == CanFocus::Yes)
			{
				const Vector2f position = child->GetAbsoluteOffset(BoxArea::Border);
				const BoundingBox target_box = {position, position + child->GetBox().GetSize(BoxArea::Border)};

				const int heuristic = GetNavigationHeuristic(bounding_box, target_box, direction);
				if (heuristic < best_result.heuristic)
				{
					best_result.element = child;
					best_result.heuristic = heuristic;
				}
			}
			else if (can_focus == CanFocus::NoAndNoChildren || IsScrollContainer(child))
			{
				continue;
			}

			SearchNavigationTarget(best_result, child, direction, bounding_box, exclude_element);
		}
	}